

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

sqlite3_filename sqlite3_db_filename(sqlite3 *db,char *zDbName)

{
  Pager *pPVar1;
  uint uVar2;
  Btree *pBVar3;
  sqlite3_filename pcVar4;
  
  if (zDbName == (char *)0x0) {
    uVar2 = 0;
  }
  else {
    uVar2 = sqlite3FindDbName(db,zDbName);
  }
  if ((int)uVar2 < 0) {
    pBVar3 = (Btree *)0x0;
  }
  else {
    pBVar3 = db->aDb[uVar2].pBt;
  }
  if (pBVar3 == (Btree *)0x0) {
    pcVar4 = (sqlite3_filename)0x0;
  }
  else {
    pPVar1 = pBVar3->pBt->pPager;
    pcVar4 = (sqlite3_filename)((long)&sqlite3PagerFilename_zFake + 4);
    if ((pPVar1->memDb == '\0') && (pPVar1->pVfs != &memdb_vfs)) {
      pcVar4 = pPVar1->zFilename;
    }
  }
  return pcVar4;
}

Assistant:

SQLITE_API const char *sqlite3_db_filename(sqlite3 *db, const char *zDbName){
  Btree *pBt;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ){
    (void)SQLITE_MISUSE_BKPT;
    return 0;
  }
#endif
  pBt = sqlite3DbNameToBtree(db, zDbName);
  return pBt ? sqlite3BtreeGetFilename(pBt) : 0;
}